

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2edbf19::Impl::startProcessingMessages(Impl *this,ClosedHandler *onClose)

{
  __int_type _Var1;
  id iVar2;
  thread local_50;
  thread local_48;
  Impl *local_40;
  _Any_data local_38;
  code *local_28;
  
  LOCK();
  _Var1 = (this->isProcessingMessages)._M_base._M_i;
  (this->isProcessingMessages)._M_base._M_i = true;
  UNLOCK();
  if ((_Var1 & 1U) != 0) {
    EventHandlers::error(&this->handlers,"Session::startProcessingMessages() called twice");
    return;
  }
  local_40 = this;
  std::function<void_()>::function((function<void_()> *)&local_38,onClose);
  local_48._M_id._M_thread = (id)0;
  iVar2._M_thread = (native_handle_type)operator_new(0x30);
  *(undefined ***)iVar2._M_thread = &PTR___State_impl_00aa5130;
  *(Impl **)(iVar2._M_thread + 8) = local_40;
  std::function<void_()>::function
            ((function<void_()> *)(iVar2._M_thread + 0x10),(function<void_()> *)&local_38);
  local_50._M_id._M_thread = (id)(id)iVar2._M_thread;
  std::thread::_M_start_thread(&local_48,&local_50,0);
  if (local_50._M_id._M_thread != 0) {
    (**(code **)(*(long *)local_50._M_id._M_thread + 8))();
  }
  if ((this->recvThread)._M_id._M_thread == 0) {
    (this->recvThread)._M_id._M_thread = (native_handle_type)local_48._M_id._M_thread;
    local_48._M_id._M_thread = (id)0;
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    local_50._M_id._M_thread = (id)0;
    local_40 = (Impl *)operator_new(0x10);
    (local_40->super_Session)._vptr_Session = (_func_int **)&PTR___State_00aa5170;
    *(Impl **)&local_40->isBound = this;
    std::thread::_M_start_thread(&local_50,&local_40,0);
    if (local_40 != (Impl *)0x0) {
      (*(local_40->super_Session)._vptr_Session[1])();
    }
    if ((this->dispatchThread)._M_id._M_thread == 0) {
      (this->dispatchThread)._M_id._M_thread = (native_handle_type)local_50._M_id._M_thread;
      return;
    }
  }
  std::terminate();
}

Assistant:

void startProcessingMessages(
      const ClosedHandler& onClose /* = {} */) override {
    if (isProcessingMessages.exchange(true)) {
      handlers.error("Session::startProcessingMessages() called twice");
      return;
    }
    recvThread = std::thread([this, onClose] {
      while (reader.isOpen()) {
        if (auto payload = getPayload()) {
          inbox.put(std::move(payload));
        }
      }
      if (onClose) {
        onClose();
      }
    });

    dispatchThread = std::thread([this] {
      while (auto payload = inbox.take()) {
        payload.value()();
      }
    });
  }